

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  pointer pVVar1;
  Module *pMVar2;
  bool bVar3;
  byte bVar4;
  uint32_t value;
  Index IVar5;
  Address AVar6;
  reference base;
  VarExpr<(wabt::ExprType)43> *pVVar7;
  SimdLaneOpExpr *pSVar8;
  OpcodeExpr<(wabt::ExprType)47> *pOVar9;
  VarExpr<(wabt::ExprType)35> *pVVar10;
  VarExpr<(wabt::ExprType)36> *pVVar11;
  VarExpr<(wabt::ExprType)27> *pVVar12;
  ConstExpr *pCVar13;
  ReturnCallIndirectExpr *pRVar14;
  VarExpr<(wabt::ExprType)11> *pVVar15;
  VarExpr<(wabt::ExprType)40> *pVVar16;
  CallIndirectExpr *pCVar17;
  VarExpr<(wabt::ExprType)8> *pVVar18;
  VarExpr<(wabt::ExprType)24> *pVVar19;
  BlockExprBase<(wabt::ExprType)7> *pBVar20;
  VarExpr<(wabt::ExprType)17> *pVVar21;
  LoadStoreExpr<(wabt::ExprType)0> *pLVar22;
  LoadStoreExpr<(wabt::ExprType)21> *pLVar23;
  VarExpr<(wabt::ExprType)18> *pVVar24;
  BrTableExpr *pBVar25;
  ulong uVar26;
  char *pcVar27;
  VarExpr<(wabt::ExprType)32> *pVVar28;
  VarExpr<(wabt::ExprType)45> *pVVar29;
  char *pcVar30;
  BlockExprBase<(wabt::ExprType)22> *pBVar31;
  LoadStoreExpr<(wabt::ExprType)39> *pLVar32;
  VarExpr<(wabt::ExprType)42> *pVVar33;
  SimdShuffleOpExpr *pSVar34;
  IfExceptExpr *pIVar35;
  RelocType reloc_type;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  int __c_00;
  Var *var_00;
  Var *var_01;
  Var *var_02;
  undefined8 extraout_RDX;
  undefined8 uVar36;
  undefined8 extraout_RDX_00;
  ExprList *exprs_00;
  Opcode OVar37;
  uint64_t uVar38;
  Stream *pSVar39;
  Var *var;
  pointer this_00;
  const_iterator rhs;
  v128 value_00;
  undefined1 local_50 [8];
  const_iterator __begin2;
  
  __begin2.list_ = (intrusive_list<wabt::Expr> *)exprs->first_;
  local_50 = (undefined1  [8])exprs;
  do {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = exprs;
    bVar3 = intrusive_list<wabt::Expr>::const_iterator::operator!=((const_iterator *)local_50,rhs);
    if (!bVar3) {
      return;
    }
    base = intrusive_list<wabt::Expr>::const_iterator::operator*((const_iterator *)local_50);
    switch(base->type_) {
    case AtomicLoad:
      pLVar22 = cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(base);
      goto LAB_00d8e8c3;
    case AtomicRmw:
      pLVar22 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(base);
      goto LAB_00d8e8c3;
    case AtomicRmwCmpxchg:
      pLVar22 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(base);
      goto LAB_00d8e8c3;
    case AtomicStore:
      pLVar22 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(base);
      goto LAB_00d8e8c3;
    case AtomicWait:
      pLVar22 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(base);
      goto LAB_00d8e8c3;
    case AtomicWake:
      pLVar22 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)5>,wabt::Expr>(base);
LAB_00d8e8c3:
      WriteOpcode(this->stream_,(Opcode)(pLVar22->opcode).enum_);
      AVar6 = Opcode::GetAlignment(&pLVar22->opcode,pLVar22->align);
      pSVar39 = this->stream_;
      bVar4 = log2_u32(AVar6);
      Stream::WriteU8(pSVar39,(uint)bVar4,"alignment",No);
      pSVar39 = this->stream_;
      value = pLVar22->offset;
      pcVar30 = "memory offset";
      break;
    case Binary:
      pSVar39 = this->stream_;
      pOVar9 = (OpcodeExpr<(wabt::ExprType)47> *)
               cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(base);
      goto LAB_00d8e989;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      pBVar20 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar20->block).decl);
      pBVar31 = (BlockExprBase<(wabt::ExprType)22> *)
                cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(base);
      goto LAB_00d8eb2a;
    case Br:
      pcVar30 = (char *)0xc;
      WriteOpcode(this->stream_,(Opcode)0xc);
      pSVar39 = this->stream_;
      pVVar18 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(base);
      __c = extraout_EDX_00;
      goto LAB_00d8ea70;
    case BrIf:
      pcVar30 = (char *)0xd;
      WriteOpcode(this->stream_,(Opcode)0xd);
      pSVar39 = this->stream_;
      pVVar18 = (VarExpr<(wabt::ExprType)8> *)
                cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(base);
      __c = extraout_EDX;
LAB_00d8ea70:
      pcVar30 = Var::index(&pVVar18->var,pcVar30,__c);
      value = (uint32_t)pcVar30;
      pcVar30 = "break depth";
      break;
    case BrTable:
      __begin2.node_ = (Expr *)exprs;
      pBVar25 = cast<wabt::BrTableExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0xe);
      uVar26 = ((long)(pBVar25->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar25->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48;
      pcVar30 = (char *)(uVar26 & 0xffffffff);
      WriteU32Leb128(this->stream_,(uint32_t)uVar26,"num targets");
      pVVar1 = (pBVar25->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar36 = extraout_RDX;
      for (this_00 = (pBVar25->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_00 != pVVar1;
          this_00 = this_00 + 1) {
        pcVar27 = Var::index(this_00,pcVar30,(int)uVar36);
        pcVar30 = (char *)((ulong)pcVar27 & 0xffffffff);
        WriteU32Leb128(this->stream_,(uint32_t)pcVar27,"break depth");
        uVar36 = extraout_RDX_00;
      }
      pcVar30 = Var::index(&pBVar25->default_target,pcVar30,(int)uVar36);
      WriteU32Leb128(this->stream_,(uint32_t)pcVar30,"break depth for default");
      exprs = (ExprList *)__begin2.node_;
      goto switchD_00d8e4a1_default;
    case Call:
      pMVar2 = this->module_;
      pVVar15 = cast<wabt::VarExpr<(wabt::ExprType)11>,wabt::Expr>(base);
      IVar5 = Module::GetFuncIndex(pMVar2,&pVVar15->var);
      pSVar39 = this->stream_;
      OVar37.enum_ = Call;
      goto LAB_00d8eaac;
    case CallIndirect:
      pMVar2 = this->module_;
      pCVar17 = cast<wabt::CallIndirectExpr,wabt::Expr>(base);
      IVar5 = Module::GetFuncTypeIndex(pMVar2,&pCVar17->decl);
      WriteOpcode(this->stream_,(Opcode)0x11);
      WriteU32Leb128WithReloc(this,IVar5,"signature index",TypeIndexLEB);
      pSVar39 = this->stream_;
      pcVar30 = "call_indirect reserved";
      goto LAB_00d8ecbb;
    case Compare:
      pSVar39 = this->stream_;
      pOVar9 = (OpcodeExpr<(wabt::ExprType)47> *)
               cast<wabt::OpcodeExpr<(wabt::ExprType)13>,wabt::Expr>(base);
      goto LAB_00d8e989;
    case Const:
      pCVar13 = cast<wabt::ConstExpr,wabt::Expr>(base);
      switch((pCVar13->const_).type) {
      case V128:
        WriteOpcode(this->stream_,(Opcode)0xce);
        pSVar39 = this->stream_;
        uVar38 = (pCVar13->const_).field_2.u64;
        uVar36 = *(undefined8 *)((long)&(pCVar13->const_).field_2 + 8);
        pcVar30 = "v128 literal";
        goto LAB_00d8ec9c;
      case F64:
        WriteOpcode(this->stream_,(Opcode)0x37);
        Stream::WriteU64(this->stream_,(pCVar13->const_).field_2.u64,"f64 literal",No);
        break;
      case F32:
        WriteOpcode(this->stream_,(Opcode)0x36);
        Stream::WriteU32(this->stream_,(pCVar13->const_).field_2.u32,"f32 literal",No);
        break;
      case I64:
        WriteOpcode(this->stream_,(Opcode)0x35);
        WriteS64Leb128(this->stream_,(pCVar13->const_).field_2.u64,"i64 literal");
        break;
      case I32:
        WriteOpcode(this->stream_,(Opcode)0x34);
        WriteS32Leb128(this->stream_,(pCVar13->const_).field_2.u32,"i32 literal");
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                      ,0x1eb,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      goto switchD_00d8e4a1_default;
    case Convert:
      pSVar39 = this->stream_;
      pOVar9 = (OpcodeExpr<(wabt::ExprType)47> *)
               cast<wabt::OpcodeExpr<(wabt::ExprType)15>,wabt::Expr>(base);
      goto LAB_00d8e989;
    case Drop:
      pSVar39 = this->stream_;
      OVar37.enum_ = Drop;
      goto LAB_00d8ed1e;
    case GetGlobal:
      pMVar2 = this->module_;
      pVVar21 = cast<wabt::VarExpr<(wabt::ExprType)17>,wabt::Expr>(base);
      IVar5 = Module::GetGlobalIndex(pMVar2,&pVVar21->var);
      pSVar39 = this->stream_;
      OVar37.enum_ = GetGlobal;
      goto LAB_00d8e838;
    case GetLocal:
      pVVar24 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar24->var,var_02);
      pSVar39 = this->stream_;
      OVar37.enum_ = GetLocal;
      goto LAB_00d8e9b4;
    case If:
      pIVar35 = (IfExceptExpr *)cast<wabt::IfExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,&(pIVar35->true_).decl);
      goto LAB_00d8ebb9;
    case IfExcept:
      pIVar35 = cast<wabt::IfExceptExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0xa);
      WriteBlockDecl(this,&(pIVar35->true_).decl);
      IVar5 = Module::GetExceptIndex(this->module_,&pIVar35->except_var);
      WriteU32Leb128(this->stream_,IVar5,"exception index");
LAB_00d8ebb9:
      WriteExprList(this,func,&(pIVar35->true_).exprs);
      if ((pIVar35->false_).size_ != 0) {
        WriteOpcode(this->stream_,(Opcode)0x5);
LAB_00d8ed0a:
        exprs_00 = &pIVar35->false_;
        goto LAB_00d8ed13;
      }
      goto LAB_00d8ed18;
    case Load:
      pLVar23 = cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pLVar23->opcode).enum_);
      AVar6 = Opcode::GetAlignment(&pLVar23->opcode,pLVar23->align);
      pSVar39 = this->stream_;
      bVar4 = log2_u32(AVar6);
      Stream::WriteU8(pSVar39,(uint)bVar4,"alignment",No);
      pSVar39 = this->stream_;
      value = pLVar23->offset;
      pcVar30 = "load offset";
      break;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      pBVar31 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar31->block).decl);
      pBVar31 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(base);
LAB_00d8eb2a:
      exprs_00 = &(pBVar31->block).exprs;
LAB_00d8ed13:
      WriteExprList(this,func,exprs_00);
LAB_00d8ed18:
      pSVar39 = this->stream_;
      OVar37.enum_ = End;
      goto LAB_00d8ed1e;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar39 = this->stream_;
      pcVar30 = "memory.copy reserved";
      goto LAB_00d8ecbb;
    case MemoryDrop:
      pMVar2 = this->module_;
      pVVar19 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(base);
      value = Module::GetDataSegmentIndex(pMVar2,&pVVar19->var);
      WriteOpcode(this->stream_,(Opcode)0xc6);
      pSVar39 = this->stream_;
      pcVar30 = "memory.drop segment";
      break;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      pSVar39 = this->stream_;
      pcVar30 = "memory.fill reserved";
      goto LAB_00d8ecbb;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar39 = this->stream_;
      pcVar30 = "memory.grow reserved";
      goto LAB_00d8ecbb;
    case MemoryInit:
      pMVar2 = this->module_;
      pVVar12 = cast<wabt::VarExpr<(wabt::ExprType)27>,wabt::Expr>(base);
      value = Module::GetDataSegmentIndex(pMVar2,&pVVar12->var);
      WriteOpcode(this->stream_,(Opcode)0xc5);
      WriteU32Leb128(this->stream_,0,"memory.init reserved");
      pSVar39 = this->stream_;
      pcVar30 = "memory.init segment";
      break;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x32);
      pSVar39 = this->stream_;
      pcVar30 = "memory.size reserved";
      goto LAB_00d8ecbb;
    case Nop:
      pSVar39 = this->stream_;
      OVar37.enum_ = Nop;
      goto LAB_00d8ed1e;
    case Rethrow:
      pSVar39 = this->stream_;
      OVar37.enum_ = Rethrow;
      goto LAB_00d8ed1e;
    case Return:
      pSVar39 = this->stream_;
      OVar37.enum_ = Return;
      goto LAB_00d8ed1e;
    case ReturnCall:
      pMVar2 = this->module_;
      pVVar28 = cast<wabt::VarExpr<(wabt::ExprType)32>,wabt::Expr>(base);
      IVar5 = Module::GetFuncIndex(pMVar2,&pVVar28->var);
      pSVar39 = this->stream_;
      OVar37.enum_ = ReturnCall;
LAB_00d8eaac:
      WriteOpcode(pSVar39,OVar37);
      pcVar30 = "block type function index";
      reloc_type = First;
LAB_00d8eac5:
      WriteU32Leb128WithReloc(this,IVar5,pcVar30 + 0xb,reloc_type);
      goto switchD_00d8e4a1_default;
    case ReturnCallIndirect:
      pMVar2 = this->module_;
      pRVar14 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(base);
      IVar5 = Module::GetFuncTypeIndex(pMVar2,&pRVar14->decl);
      WriteOpcode(this->stream_,(Opcode)0x13);
      WriteU32Leb128WithReloc(this,IVar5,"signature index",TypeIndexLEB);
      pSVar39 = this->stream_;
      pcVar30 = "return_call_indirect reserved";
      goto LAB_00d8ecbb;
    case Select:
      pSVar39 = this->stream_;
      OVar37.enum_ = Select;
      goto LAB_00d8ed1e;
    case SetGlobal:
      pMVar2 = this->module_;
      pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(base);
      IVar5 = Module::GetGlobalIndex(pMVar2,&pVVar10->var);
      pSVar39 = this->stream_;
      OVar37.enum_ = SetGlobal;
LAB_00d8e838:
      WriteOpcode(pSVar39,OVar37);
      pcVar30 = "get_global global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_00d8eac5;
    case SetLocal:
      pVVar11 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar11->var,var_01);
      pSVar39 = this->stream_;
      OVar37.enum_ = SetLocal;
      goto LAB_00d8e9b4;
    case SimdLaneOp:
      pSVar8 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar8->opcode).enum_);
      pSVar39 = this->stream_;
      pSVar8 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      Stream::WriteU8(pSVar39,(uint)(byte)pSVar8->val,"Simd Lane literal",No);
      goto switchD_00d8e4a1_default;
    case SimdShuffleOp:
      pSVar34 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar34->opcode).enum_);
      pSVar39 = this->stream_;
      pSVar34 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      uVar38 = *(uint64_t *)(pSVar34->val).v;
      uVar36 = *(undefined8 *)((pSVar34->val).v + 2);
      pcVar30 = "Simd Lane[16] literal";
LAB_00d8ec9c:
      value_00.v[2] = (int)uVar36;
      value_00.v[3] = (int)((ulong)uVar36 >> 0x20);
      value_00.v[0] = (int)uVar38;
      value_00.v[1] = (int)(uVar38 >> 0x20);
      Stream::WriteU128(pSVar39,value_00,pcVar30,No);
      goto switchD_00d8e4a1_default;
    case Store:
      pLVar32 = cast<wabt::LoadStoreExpr<(wabt::ExprType)39>,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pLVar32->opcode).enum_);
      AVar6 = Opcode::GetAlignment(&pLVar32->opcode,pLVar32->align);
      pSVar39 = this->stream_;
      bVar4 = log2_u32(AVar6);
      Stream::WriteU8(pSVar39,(uint)bVar4,"alignment",No);
      pSVar39 = this->stream_;
      value = pLVar32->offset;
      pcVar30 = "store offset";
      break;
    case TableInit:
      pMVar2 = this->module_;
      pVVar16 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(base);
      value = Module::GetElemSegmentIndex(pMVar2,&pVVar16->var);
      WriteOpcode(this->stream_,(Opcode)0xc9);
      WriteU32Leb128(this->stream_,0,"table.init reserved");
      pSVar39 = this->stream_;
      pcVar30 = "table.init segment";
      break;
    case TableCopy:
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar39 = this->stream_;
      pcVar30 = "table.copy reserved";
LAB_00d8ecbb:
      value = 0;
      break;
    case TableDrop:
      pMVar2 = this->module_;
      pVVar33 = cast<wabt::VarExpr<(wabt::ExprType)42>,wabt::Expr>(base);
      value = Module::GetElemSegmentIndex(pMVar2,&pVVar33->var);
      WriteOpcode(this->stream_,(Opcode)0xca);
      pSVar39 = this->stream_;
      pcVar30 = "table.drop segment";
      break;
    case TeeLocal:
      pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)43>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar7->var,var_00);
      pSVar39 = this->stream_;
      OVar37.enum_ = TeeLocal;
LAB_00d8e9b4:
      WriteOpcode(pSVar39,OVar37);
      pSVar39 = this->stream_;
      pcVar30 = "local index";
      break;
    case Ternary:
      pSVar39 = this->stream_;
      pOVar9 = (OpcodeExpr<(wabt::ExprType)47> *)
               cast<wabt::OpcodeExpr<(wabt::ExprType)44>,wabt::Expr>(base);
      goto LAB_00d8e989;
    case Throw:
      pcVar30 = (char *)0x8;
      WriteOpcode(this->stream_,(Opcode)0x8);
      pSVar39 = this->stream_;
      pVVar29 = cast<wabt::VarExpr<(wabt::ExprType)45>,wabt::Expr>(base);
      pcVar30 = Var::index(&pVVar29->var,pcVar30,__c_00);
      value = (uint32_t)pcVar30;
      pcVar30 = "throw exception";
      break;
    case Try:
      pIVar35 = (IfExceptExpr *)cast<wabt::TryExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,&(pIVar35->true_).decl);
      WriteExprList(this,func,&(pIVar35->true_).exprs);
      WriteOpcode(this->stream_,(Opcode)0x7);
      goto LAB_00d8ed0a;
    case Unary:
      pSVar39 = this->stream_;
      pOVar9 = cast<wabt::OpcodeExpr<(wabt::ExprType)47>,wabt::Expr>(base);
LAB_00d8e989:
      OVar37.enum_ = (pOVar9->opcode).enum_;
      goto LAB_00d8ed1e;
    case Last:
      pSVar39 = this->stream_;
      OVar37.enum_ = Unreachable;
LAB_00d8ed1e:
      WriteOpcode(pSVar39,OVar37);
    default:
      goto switchD_00d8e4a1_default;
    }
    WriteU32Leb128(pSVar39,value,pcVar30);
switchD_00d8e4a1_default:
    intrusive_list<wabt::Expr>::const_iterator::operator++((const_iterator *)local_50);
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}